

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O0

int __thiscall FastPForLib::ZipfianGenerator::init(ZipfianGenerator *this,EVP_PKEY_CTX *ctx)

{
  uint extraout_EAX;
  runtime_error *this_00;
  reference pvVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint32_t i;
  double in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  value_type vVar6;
  ZipfianGenerator *in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  uint local_34;
  
  this->n = (uint32_t)ctx;
  if ((uint32_t)ctx != 0) {
    this->theta = in_XMM0_Qa;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->theta;
    if (this->theta <= 0.0) {
      auVar4 = vcvtusi2sd_avx512f(auVar4,this->n);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(1.0 / auVar4._0_8_),(size_type)this,
                 in_stack_ffffffffffffffb0);
      local_34 = extraout_EAX;
    }
    else {
      dVar2 = zeta(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   in_stack_ffffffffffffff90);
      this->zetan = 1.0 / dVar2;
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x10db99);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffc0,(size_type)this,in_stack_ffffffffffffffb0);
      vVar6 = this->zetan;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&this->proba,0);
      *pvVar1 = vVar6;
      for (local_34 = 1; local_34 < this->n; local_34 = local_34 + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->proba,(ulong)(local_34 - 1));
        vVar6 = *pvVar1;
        dVar2 = this->zetan;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar2;
        auVar4 = vcvtusi2sd_avx512f(auVar5,local_34 + 1);
        dVar3 = pow(auVar4._0_8_,this->theta);
        dVar2 = vVar6 + dVar2 / dVar3;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->proba,(ulong)local_34);
        *pvVar1 = dVar2;
      }
    }
    return local_34;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"no items?");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(int _items, double _zipfianconstant = 1.0) {
    n = _items;
    if (_items == 0)
      throw std::runtime_error("no items?");
    theta = _zipfianconstant;
    if (theta > 0) {
      zetan = 1 / zeta(n, theta);
      proba.clear();
      proba.resize(n, 0);
      proba[0] = zetan;
      for (uint32_t i = 1; i < n; ++i)
        proba[i] = proba[i - 1] + zetan / pow(i + 1, theta);
    } else {
      proba.resize(n, 1.0 / n);
    }
  }